

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O2

axbStatus_t axbVecMAXPY(axbVec_s *y,size_t num_vecs,axbScalar_s **alpha,axbVec_s **x)

{
  axbVec_s **ppaVar1;
  size_t i;
  size_t sVar2;
  
  if (y->init == 0x1d232) {
    sVar2 = 0;
    do {
      if (num_vecs == sVar2) {
        (*y->opBackend->op_table[0x14].func)();
        return 0;
      }
      ppaVar1 = x + sVar2;
      sVar2 = sVar2 + 1;
    } while ((*ppaVar1)->init == 0x1d232);
  }
  fwrite("Vector not fully initialized!\n",0x1e,1,_stderr);
  return 0x1d232;
}

Assistant:

axbStatus_t axbVecMAXPY(struct axbVec_s *y, size_t num_vecs, const struct axbScalar_s * const *alpha, const struct axbVec_s * const *x)
{
  AXB_VECTOR_INIT_CHECK(y);
  for (size_t i=0; i<num_vecs; ++i) AXB_VECTOR_INIT_CHECK(x[i]);

  axbOpDescriptor_t op_desc = y->opBackend->op_table[AXB_OP_VEC_MAXPY];
  axbStatus_t (*op)(struct axbVec_s *, size_t, const struct axbScalar_s * const *, const struct axbVec_s * const *, void*) = (axbStatus_t (*)(struct axbVec_s *, size_t, const struct axbScalar_s * const *, const struct axbVec_s * const *, void*)) op_desc.func;
  op(y, num_vecs, alpha, x, op_desc.func_data);
  return 0;
}